

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__interval
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  URI *this_00;
  ParserChar *text;
  long lVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  uint *puVar7;
  StringHash SVar8;
  void *pvVar9;
  uint uVar10;
  uint *puVar11;
  ulong uVar12;
  xmlChar **ppxVar13;
  bool failed_1;
  ParserChar *attributeValue;
  bool failed;
  bool local_139;
  ParserChar *local_138;
  StackMemoryManager *local_130;
  XSList<GeneratedSaxParser::ParserString> *local_128;
  uint *local_120;
  URI local_118;
  
  local_130 = &(this->
               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
               ).super_ParserTemplateBase.mStackMemoryManager;
  puVar7 = (uint *)GeneratedSaxParser::StackMemoryManager::newObject(local_130,0x128);
  uVar2 = interval__AttributeData::DEFAULT._8_8_;
  *(undefined8 *)puVar7 = interval__AttributeData::DEFAULT._0_8_;
  *(undefined8 *)(puVar7 + 2) = uVar2;
  uVar2 = interval__AttributeData::DEFAULT._24_8_;
  *(undefined8 *)(puVar7 + 4) = interval__AttributeData::DEFAULT._16_8_;
  *(undefined8 *)(puVar7 + 6) = uVar2;
  uVar2 = interval__AttributeData::DEFAULT._40_8_;
  *(undefined8 *)(puVar7 + 8) = interval__AttributeData::DEFAULT._32_8_;
  *(undefined8 *)(puVar7 + 10) = uVar2;
  this_00 = (URI *)(puVar7 + 0xc);
  COLLADABU::URI::URI(this_00,(URI *)(interval__AttributeData::DEFAULT + 0x30),false);
  uVar5 = interval__AttributeData::DEFAULT._292_4_;
  uVar4 = interval__AttributeData::DEFAULT._288_4_;
  uVar3 = interval__AttributeData::DEFAULT._284_4_;
  puVar7[0x46] = interval__AttributeData::DEFAULT._280_4_;
  puVar7[0x47] = uVar3;
  puVar7[0x48] = uVar4;
  puVar7[0x49] = uVar5;
  *attributeDataPtr = puVar7;
  ppxVar13 = attributes->attributes;
  if (ppxVar13 != (xmlChar **)0x0) {
    local_120 = puVar7 + 0x46;
    local_128 = (XSList<GeneratedSaxParser::ParserString> *)(puVar7 + 2);
    do {
      text = *ppxVar13;
      if (text == (ParserChar *)0x0) {
        validationDataPtr = (void **)0x3;
      }
      else {
        SVar8 = GeneratedSaxParser::Utils::calculateStringHash(text);
        local_138 = ppxVar13[1];
        if ((long)SVar8 < 0x6a28a3) {
          if (SVar8 == 0x6f4) {
            *(ParserChar **)(puVar7 + 10) = local_138;
          }
          else if (SVar8 == 0x6f8b6) {
            GeneratedSaxParser::Utils::toURI(&local_118,&local_138,&local_139);
            COLLADABU::URI::operator=(this_00,&local_118);
            COLLADABU::URI::~URI(&local_118);
            if ((local_139 == true) &&
               (bVar6 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                   ERROR_ATTRIBUTE_PARSING_FAILED,0x5ac9b7c,0x6f8b6,local_138),
               bVar6)) {
LAB_0076e0d6:
              bVar6 = false;
              validationDataPtr = (void **)0x1;
            }
            else {
              validationDataPtr = (void **)0x4;
              bVar6 = true;
              if (local_139 == false) {
                *(byte *)puVar7 = (byte)*puVar7 | 2;
              }
            }
LAB_0076e0f9:
            if (!bVar6) goto LAB_0076e16e;
          }
          else if (SVar8 == 0x7f8b6) {
            *(ParserChar **)(puVar7 + 8) = local_138;
          }
          else {
LAB_0076e05d:
            if (*(long *)local_120 == 0) {
              pvVar9 = GeneratedSaxParser::StackMemoryManager::newObject(local_130,0x10);
            }
            else {
              pvVar9 = GeneratedSaxParser::StackMemoryManager::growObject(local_130,0x10);
            }
            *(void **)(puVar7 + 0x46) = pvVar9;
            lVar1 = *(long *)(puVar7 + 0x48);
            *(ParserChar **)((long)pvVar9 + lVar1 * 8) = text;
            *(ParserChar **)(*(long *)(puVar7 + 0x46) + 8 + lVar1 * 8) = local_138;
            *(long *)(puVar7 + 0x48) = lVar1 + 2;
          }
LAB_0076e16c:
          validationDataPtr = (void **)0x0;
        }
        else {
          if (SVar8 != 0x6a28a3) {
            if (SVar8 != 0x7ac025) {
              if (SVar8 != 0xa36ace5) goto LAB_0076e05d;
              SVar8 = GeneratedSaxParser::Utils::calculateStringHash(local_138,(bool *)&local_118);
              bVar6 = false;
              uVar12 = 0;
              puVar11 = &DAT_0085b4a8;
              do {
                if (*(StringHash *)(puVar11 + -2) == SVar8) {
                  local_118.mUriString._M_dataplus._M_p._0_1_ = '\0';
                  validationDataPtr = (void **)(ulong)*puVar11;
                }
                uVar10 = (uint)validationDataPtr;
                if (*(StringHash *)(puVar11 + -2) == SVar8) break;
                bVar6 = 2 < uVar12;
                uVar12 = uVar12 + 1;
                puVar11 = puVar11 + 4;
              } while (uVar12 != 4);
              if (bVar6) {
                local_118.mUriString._M_dataplus._M_p._0_1_ = '\x01';
                uVar10 = 4;
              }
              puVar7[1] = uVar10;
              if (((char)local_118.mUriString._M_dataplus._M_p == '\x01') &&
                 (bVar6 = GeneratedSaxParser::ParserTemplateBase::handleError
                                    ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                     ERROR_ATTRIBUTE_PARSING_FAILED,0x5ac9b7c,0xa36ace5,local_138),
                 bVar6)) goto LAB_0076e0d6;
              validationDataPtr = (void **)0x4;
              bVar6 = true;
              goto LAB_0076e0f9;
            }
            *(ParserChar **)(puVar7 + 6) = local_138;
            goto LAB_0076e16c;
          }
          bVar6 = GeneratedSaxParser::
                  ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                  ::
                  characterData2List<GeneratedSaxParser::ParserString,_&GeneratedSaxParser::Utils::toStringListItem>
                            (&this->
                              super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                             ,local_138,local_128);
          if (bVar6) {
            *(byte *)puVar7 = (byte)*puVar7 | 1;
            validationDataPtr = (void **)0x4;
            bVar6 = true;
          }
          else {
            bVar6 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0x5ac9b7c,0x6a28a3,local_138);
            bVar6 = !bVar6;
            validationDataPtr = (void **)(ulong)((uint)bVar6 + (uint)bVar6 * 2 + 1);
          }
          if (bVar6) goto LAB_0076e16c;
        }
LAB_0076e16e:
        ppxVar13 = ppxVar13 + 2;
      }
    } while ((int)validationDataPtr == 0);
    if ((int)validationDataPtr != 3) {
      return false;
    }
  }
  if ((*puVar7 & 1) == 0) {
    puVar7[2] = 0;
    puVar7[3] = 0;
    puVar7[4] = 0;
    puVar7[5] = 0;
  }
  if ((*puVar7 & 2) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(this_00,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__interval( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__interval( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

interval__AttributeData* attributeData = newData<interval__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_CLOSURE:
    {
bool failed;
attributeData->closure = Utils::toEnum<ENUM__mathml__interval__closure, StringHash, ENUM__mathml__interval__closure__COUNT>(attributeValue, failed, ENUM__mathml__interval__closureMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INTERVAL,
        HASH_ATTRIBUTE_CLOSURE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_CLASS:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->_class, &validate__NMTOKEN, HASH_ELEMENT_INTERVAL, HASH_ATTRIBUTE_CLASS);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->_class);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INTERVAL,
        HASH_ATTRIBUTE_CLASS,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NMTOKENS(attributeData->_class.data, attributeData->_class.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_INTERVAL,
            HASH_ATTRIBUTE_CLASS,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= interval__AttributeData::ATTRIBUTE__CLASS_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_STYLE:
    {

attributeData->style = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_XREF:
    {

attributeData->xref = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_HREF:
    {
bool failed;
attributeData->href = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INTERVAL,
        HASH_ATTRIBUTE_HREF,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= interval__AttributeData::ATTRIBUTE_HREF_PRESENT;

    break;
    }
    default:
    {
        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;

    }
    }
    }
}
if ((attributeData->present_attributes & interval__AttributeData::ATTRIBUTE__CLASS_PRESENT) == 0)
{
    attributeData->_class = GeneratedSaxParser::XSList<ParserString>();
}
if ((attributeData->present_attributes & interval__AttributeData::ATTRIBUTE_HREF_PRESENT) == 0)
{
    attributeData->href = COLLADABU::URI("");
}


    return true;
}